

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O3

void __thiscall cxxpool::thread_pool::thread_pool(thread_pool *this)

{
  initializer_list<unsigned_long> __l;
  unsigned_long local_30;
  allocator_type local_21;
  
  this->done_ = false;
  this->paused_ = false;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = 0;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->task_counter_).count_,__l,&local_21);
  std::condition_variable::condition_variable(&this->task_cond_var_);
  (this->thread_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->thread_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->thread_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->thread_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->task_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->thread_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->task_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->task_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->task_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->task_mutex_).super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

thread_pool()
    : done_{false}, paused_{false}, threads_{}, tasks_{}, task_counter_{},
      task_cond_var_{}, task_mutex_{}, thread_mutex_{}
    {}